

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O2

void swrenderer::R_ProjectParticle
               (particle_t *particle,sector_t_conflict *sector,int shade,int fakeside)

{
  BYTE *pBVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  FTextureID FVar5;
  sector_t_conflict *psVar6;
  vissprite_t *pvVar7;
  int iVar8;
  FTextureID *pFVar9;
  BYTE *pBVar10;
  int iVar11;
  FTextureID *pFVar12;
  secplane_t *this;
  secplane_t *this_00;
  int iVar13;
  double dVar14;
  double dVar15;
  DVector2 local_68;
  double local_58;
  double local_48;
  double dStack_40;
  
  if (CurrentPortal != 0) {
    local_68.X = (particle->Pos).X;
    local_68.Y = (particle->Pos).Y;
    iVar3 = P_PointOnLineSide(&local_68,*(line_t_conflict **)(CurrentPortal + 8));
    if (iVar3 != 0) {
      return;
    }
  }
  dVar14 = (particle->Pos).X - ViewPos.X;
  dVar2 = (particle->Pos).Y - ViewPos.Y;
  dStack_40 = ViewTanSin * dVar2;
  local_48 = dStack_40 + ViewTanCos * dVar14;
  dStack_40 = dStack_40 + dStack_40;
  if (0.0078125 <= local_48) {
    dVar14 = ViewSin * dVar14 - ViewCos * dVar2;
    if ((MirrorFlags & 1) != 0) {
      dVar14 = (-1.0 - dVar14) + (double)viewwidth;
    }
    if (ABS(dVar14) < local_48) {
      dVar15 = 1.0 / local_48;
      dVar2 = particle->size * 0.125;
      local_58 = (double)centerx * dVar15;
      iVar3 = SUB84((dVar14 - dVar2) * local_58 + 6755399441055744.0,0) + centerx;
      if (iVar3 < WindowLeft) {
        iVar3 = WindowLeft;
      }
      iVar13 = SUB84((dVar2 + dVar14) * local_58 + 6755399441055744.0,0) + centerx;
      if (WindowRight < iVar13) {
        iVar13 = WindowRight;
      }
      if (iVar3 < iVar13) {
        dVar14 = (particle->Pos).Z - ViewPos.Z;
        iVar4 = SUB84((CenterY + 6755399441055744.0) - (dVar14 + dVar2) * YaspectMul * local_58,0);
        iVar11 = (int)(short)(&ceilingclip)[iVar3];
        if ((short)(&ceilingclip)[iVar3] < iVar4) {
          iVar11 = iVar4;
        }
        if (iVar11 <= *(short *)(&DAT_017813ce + (long)iVar13 * 2)) {
          iVar11 = (int)*(short *)(&DAT_017813ce + (long)iVar13 * 2);
        }
        iVar8 = SUB84((dVar2 - dVar14) * YaspectMul * local_58 + CenterY + 6755399441055744.0,0);
        iVar4 = (short)(&floorclip)[iVar3] + -1;
        if (iVar8 < (short)(&floorclip)[iVar3]) {
          iVar4 = iVar8;
        }
        iVar8 = *(short *)(&DAT_0177e6ce + (long)iVar13 * 2) + -1;
        if (iVar4 < *(short *)(&DAT_0177e6ce + (long)iVar13 * 2)) {
          iVar8 = iVar4;
        }
        if (iVar11 <= iVar8) {
          psVar6 = sector_t::GetHeightSec(sector);
          if (psVar6 == (sector_t_conflict *)0x0) {
            this_00 = &sector->ceilingplane;
            this = &sector->floorplane;
            pFVar12 = &sector->planes[1].Texture;
            pFVar9 = &sector->planes[0].Texture;
          }
          else if (fakeside == 1) {
            this_00 = &psVar6->floorplane;
            this = &sector->floorplane;
            pFVar12 = &psVar6->planes[0].Texture;
            pFVar9 = &sector->planes[0].Texture;
            sector = psVar6;
          }
          else if (fakeside == 2) {
            this_00 = &sector->ceilingplane;
            this = &psVar6->ceilingplane;
            pFVar12 = &sector->planes[1].Texture;
            pFVar9 = &psVar6->planes[1].Texture;
            sector = psVar6;
          }
          else {
            this_00 = &psVar6->ceilingplane;
            this = &psVar6->floorplane;
            pFVar12 = &psVar6->planes[1].Texture;
            pFVar9 = &psVar6->planes[0].Texture;
          }
          iVar4 = pFVar12->texnum;
          pBVar1 = sector->ColorMap->Maps;
          FVar5.texnum = pFVar9->texnum;
          if (pFVar9->texnum != skyflatnum.texnum) {
            dVar14 = (particle->Pos).Z;
            local_68.X = (particle->Pos).X;
            local_68.Y = (particle->Pos).Y;
            dVar2 = secplane_t::ZatPoint(this,&local_68);
            FVar5 = skyflatnum;
            if (dVar14 < dVar2) {
              return;
            }
          }
          if (iVar4 != FVar5.texnum) {
            dVar14 = (particle->Pos).Z;
            local_68.X = (particle->Pos).X;
            local_68.Y = (particle->Pos).Y;
            dVar2 = secplane_t::ZatPoint(this_00,&local_68);
            if (dVar2 <= dVar14) {
              return;
            }
          }
          pvVar7 = R_NewVisSprite();
          pvVar7->CurrentPortalUniq = CurrentPortalUniq;
          pvVar7->heightsec = psVar6;
          pvVar7->xscale = SUB84(local_58 + 103079215104.0,0);
          pvVar7->yscale = (float)local_58;
          pvVar7->depth = (float)local_48;
          pvVar7->idepth = (float)dVar15;
          (pvVar7->gpos).Z = (float)(particle->Pos).Z;
          dVar14 = (particle->Pos).Y;
          (pvVar7->gpos).X = (float)(particle->Pos).X;
          (pvVar7->gpos).Y = (float)dVar14;
          (pvVar7->field_3).field_1.y1 = iVar11;
          (pvVar7->field_3).field_1.y2 = iVar8;
          pvVar7->x1 = (short)iVar3;
          pvVar7->x2 = (short)iVar13;
          pvVar7->Translation = 0;
          *(uint *)((long)&pvVar7->field_14 + 8) = (uint)*(byte *)((long)&particle->color + 3);
          (pvVar7->field_13).pic = (FTexture *)0x0;
          pvVar7->field_0x90 = pvVar7->field_0x90 & 0xfe;
          pvVar7->renderflags = (ushort)particle->trans;
          pvVar7->FakeFlatStat = (BYTE)fakeside;
          pvVar7->floorclip = 0.0;
          pvVar7->ColormapNum = '\0';
          if ((long)fixedlightlev < 0) {
            pBVar10 = fixedcolormap;
            if (fixedcolormap == (BYTE *)0x0) {
              if (particle->bright == '\0') {
                dVar14 = dVar15 * 0.5 * r_SpriteVisibility;
                if (24.0 <= dVar14) {
                  dVar14 = 24.0;
                }
                iVar13 = shade - SUB84(dVar14 + 103079215104.0,0) >> 0x10;
                iVar3 = 0x1f;
                if (iVar13 < 0x1f) {
                  iVar3 = iVar13;
                }
                iVar13 = 0;
                if (0 < iVar3) {
                  iVar13 = iVar3;
                }
                pvVar7->ColormapNum = (BYTE)iVar13;
                pBVar10 = pBVar1 + (uint)(iVar13 << 8);
              }
              else {
                pBVar10 = pBVar1;
                if (r_fullbrightignoresectorcolor.Value != false) {
                  pBVar10 = FullNormalLight.Maps;
                }
              }
            }
          }
          else {
            pBVar10 = pBVar1 + fixedlightlev;
          }
          (pvVar7->Style).colormap = pBVar10;
        }
      }
    }
  }
  return;
}

Assistant:

void R_ProjectParticle (particle_t *particle, const sector_t *sector, int shade, int fakeside)
{
	double 				tr_x, tr_y;
	double 				tx, ty;
	double	 			tz, tiz;
	double	 			xscale, yscale;
	int 				x1, x2, y1, y2;
	vissprite_t*		vis;
	sector_t*			heightsec = NULL;
	BYTE*				map;

	// [ZZ] Particle not visible through the portal plane
	if (CurrentPortal && !!P_PointOnLineSide(particle->Pos, CurrentPortal->dst))
		return;

	// transform the origin point
	tr_x = particle->Pos.X - ViewPos.X;
	tr_y = particle->Pos.Y - ViewPos.Y;

	tz = tr_x * ViewTanCos + tr_y * ViewTanSin;

	// particle is behind view plane?
	if (tz < MINZ)
		return;

	tx = tr_x * ViewSin - tr_y * ViewCos;

	// Flip for mirrors
	if (MirrorFlags & RF_XFLIP)
	{
		tx = viewwidth - tx - 1;
	}

	// too far off the side?
	if (tz <= fabs(tx))
		return;

	tiz = 1 / tz;
	xscale = centerx * tiz;

	// calculate edges of the shape
	double psize = particle->size / 8.0;

	x1 = MAX<int>(WindowLeft, centerx + xs_RoundToInt((tx - psize) * xscale));
	x2 = MIN<int>(WindowRight, centerx + xs_RoundToInt((tx + psize) * xscale));

	if (x1 >= x2)
		return;

	yscale = YaspectMul * xscale;
	ty = particle->Pos.Z - ViewPos.Z;
	y1 = xs_RoundToInt(CenterY - (ty + psize) * yscale);
	y2 = xs_RoundToInt(CenterY - (ty - psize) * yscale);

	// Clip the particle now. Because it's a point and projected as its subsector is
	// entered, we don't need to clip it to drawsegs like a normal sprite.

	// Clip particles behind walls.
	if (y1 <  ceilingclip[x1])		y1 = ceilingclip[x1];
	if (y1 <  ceilingclip[x2-1])	y1 = ceilingclip[x2-1];
	if (y2 >= floorclip[x1])		y2 = floorclip[x1] - 1;
	if (y2 >= floorclip[x2-1])		y2 = floorclip[x2-1] - 1;

	if (y1 > y2)
		return;

	// Clip particles above the ceiling or below the floor.
	heightsec = sector->GetHeightSec();

	const secplane_t *topplane;
	const secplane_t *botplane;
	FTextureID toppic;
	FTextureID botpic;

	if (heightsec)	// only clip things which are in special sectors
	{
		if (fakeside == FAKED_AboveCeiling)
		{
			topplane = &sector->ceilingplane;
			botplane = &heightsec->ceilingplane;
			toppic = sector->GetTexture(sector_t::ceiling);
			botpic = heightsec->GetTexture(sector_t::ceiling);
			map = heightsec->ColorMap->Maps;
		}
		else if (fakeside == FAKED_BelowFloor)
		{
			topplane = &heightsec->floorplane;
			botplane = &sector->floorplane;
			toppic = heightsec->GetTexture(sector_t::floor);
			botpic = sector->GetTexture(sector_t::floor);
			map = heightsec->ColorMap->Maps;
		}
		else
		{
			topplane = &heightsec->ceilingplane;
			botplane = &heightsec->floorplane;
			toppic = heightsec->GetTexture(sector_t::ceiling);
			botpic = heightsec->GetTexture(sector_t::floor);
			map = sector->ColorMap->Maps;
		}
	}
	else
	{
		topplane = &sector->ceilingplane;
		botplane = &sector->floorplane;
		toppic = sector->GetTexture(sector_t::ceiling);
		botpic = sector->GetTexture(sector_t::floor);
		map = sector->ColorMap->Maps;
	}

	if (botpic != skyflatnum && particle->Pos.Z < botplane->ZatPoint (particle->Pos))
		return;
	if (toppic != skyflatnum && particle->Pos.Z >= topplane->ZatPoint (particle->Pos))
		return;

	// store information in a vissprite
	vis = R_NewVisSprite ();
	vis->CurrentPortalUniq = CurrentPortalUniq;
	vis->heightsec = heightsec;
	vis->xscale = FLOAT2FIXED(xscale);
	vis->yscale = (float)xscale;
//	vis->yscale *= InvZtoScale;
	vis->depth = (float)tz;
	vis->idepth = float(1 / tz);
	vis->gpos = { (float)particle->Pos.X, (float)particle->Pos.Y, (float)particle->Pos.Z };
	vis->y1 = y1;
	vis->y2 = y2;
	vis->x1 = x1;
	vis->x2 = x2;
	vis->Translation = 0;
	vis->startfrac = 255 & (particle->color >>24);
	vis->pic = NULL;
	vis->bIsVoxel = false;
	vis->renderflags = particle->trans;
	vis->FakeFlatStat = fakeside;
	vis->floorclip = 0;
	vis->ColormapNum = 0;

	if (fixedlightlev >= 0)
	{
		vis->Style.colormap = map + fixedlightlev;
	}
	else if (fixedcolormap)
	{
		vis->Style.colormap = fixedcolormap;
	}
	else if (particle->bright)
	{
		vis->Style.colormap = (r_fullbrightignoresectorcolor) ? FullNormalLight.Maps : map;
	}
	else
	{
		// Particles are slightly more visible than regular sprites.
		vis->ColormapNum = GETPALOOKUP(tiz * r_SpriteVisibility * 0.5, shade);
		vis->Style.colormap = map + (vis->ColormapNum << COLORMAPSHIFT);
	}
}